

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O0

void snmalloc::CombiningLockNode::wake<snmalloc::PALLinux>
               (CombiningLockNode *node,LockStatus message)

{
  LockStatus LVar1;
  LockStatus in_ESI;
  atomic<snmalloc::CombiningLockNode::LockStatus> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  LVar1 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::exchange(in_RDI,in_ESI,acq_rel);
  if (LVar1 == SLEEPING) {
    PALLinux::notify_one_on_address<snmalloc::CombiningLockNode::LockStatus>
              ((Atomic<snmalloc::CombiningLockNode::LockStatus> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

static void wake(CombiningLockNode* node, LockStatus message)
    {
      if constexpr (!use_wait_on_address<Pal>)
      {
        node->set_status(message);
      }
      else
      {
        if (
          node->status.exchange(message, stl::memory_order_acq_rel) ==
          LockStatus::SLEEPING)
        {
          Pal::notify_one_on_address(node->status);
        }
      }
    }